

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
          (JavascriptPromiseCapability *this,SnapPromiseCapabilityInfo *snapPromiseCapability,
          List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *depOnList,SlabAllocator *alloc)

{
  Var pvVar1;
  bool bVar2;
  void *in_RAX;
  void *local_28;
  
  snapPromiseCapability->CapabilityId = (TTD_PTR_ID)this;
  pvVar1 = (this->promise).ptr;
  snapPromiseCapability->PromiseVar = pvVar1;
  local_28 = in_RAX;
  bVar2 = TTD::JsSupport::IsVarComplexKind(pvVar1);
  if (bVar2) {
    local_28 = (this->resolve).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(depOnList,(unsigned_long *)&local_28);
  }
  pvVar1 = (this->resolve).ptr;
  snapPromiseCapability->ResolveVar = pvVar1;
  bVar2 = TTD::JsSupport::IsVarComplexKind(pvVar1);
  if (bVar2) {
    local_28 = (this->resolve).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(depOnList,(unsigned_long *)&local_28);
  }
  pvVar1 = (this->reject).ptr;
  snapPromiseCapability->RejectVar = pvVar1;
  bVar2 = TTD::JsSupport::IsVarComplexKind(pvVar1);
  if (bVar2) {
    local_28 = (this->reject).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(depOnList,(unsigned_long *)&local_28);
  }
  return;
}

Assistant:

void JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto(TTD::NSSnapValues::SnapPromiseCapabilityInfo* snapPromiseCapability, JsUtil::List<TTD_PTR_ID, HeapAllocator>& depOnList, TTD::SlabAllocator& alloc)
    {
        snapPromiseCapability->CapabilityId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this);

        snapPromiseCapability->PromiseVar = this->promise;
        if(TTD::JsSupport::IsVarComplexKind(this->promise))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->resolve));
        }

        snapPromiseCapability->ResolveVar = this->resolve;
        if(TTD::JsSupport::IsVarComplexKind(this->resolve))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->resolve));
        }

        snapPromiseCapability->RejectVar = this->reject;
        if(TTD::JsSupport::IsVarComplexKind(this->reject))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->reject));
        }
    }